

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall re2::Compiler::FindByteRange(Compiler *this,int root,int id)

{
  bool bVar1;
  Inst *pIVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  LogMessage local_1a0;
  
  uVar4 = (ulong)(uint)root;
  pIVar2 = this->inst_;
  if ((pIVar2[root].out_opcode_ & 7) == 2) {
    bVar1 = ByteRangeEqual(this,root,id);
    uVar3 = 0;
    if (!bVar1) {
      root = 0;
    }
    uVar4 = (ulong)(uint)root;
  }
  else {
    do {
      uVar5 = (uint)uVar4;
      if ((pIVar2[(int)uVar5].out_opcode_ & 7) != 0) {
        LogMessage::LogMessage
                  (&local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc"
                   ,0x26f,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a0.str_,"should never happen",0x13);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
LAB_0011ffc3:
        uVar3 = 0;
        uVar4 = 0;
        goto LAB_0011ffd2;
      }
      bVar1 = ByteRangeEqual(this,pIVar2[(int)uVar5].field_1.cap_,id);
      if (bVar1) {
        uVar3 = (ulong)(uVar5 * 2 + 1);
        goto LAB_0011ffd2;
      }
      if (this->reversed_ != true) goto LAB_0011ffc3;
      pIVar2 = this->inst_;
      uVar6 = pIVar2[(int)uVar5].out_opcode_ >> 4;
      uVar4 = (ulong)uVar6;
    } while ((pIVar2[uVar4].out_opcode_ & 7) == 0);
    bVar1 = ByteRangeEqual(this,uVar6,id);
    uVar3 = (ulong)(uVar5 * 2);
    if (!bVar1) {
      uVar3 = 0;
    }
    uVar6 = 0;
    if (bVar1) {
      uVar6 = uVar5;
    }
    uVar4 = (ulong)uVar6;
  }
LAB_0011ffd2:
  return (Frag)(uVar4 | uVar3 << 0x20);
}

Assistant:

Frag Compiler::FindByteRange(int root, int id) {
  if (inst_[root].opcode() == kInstByteRange) {
    if (ByteRangeEqual(root, id))
      return Frag(root, nullPatchList);
    else
      return NoMatch();
  }

  while (inst_[root].opcode() == kInstAlt) {
    int out1 = inst_[root].out1();
    if (ByteRangeEqual(out1, id))
      return Frag(root, PatchList::Mk((root << 1) | 1));

    // CharClass is a sorted list of ranges, so if out1 of the root Alt wasn't
    // what we're looking for, then we can stop immediately. Unfortunately, we
    // can't short-circuit the search in reverse mode.
    if (!reversed_)
      return NoMatch();

    int out = inst_[root].out();
    if (inst_[out].opcode() == kInstAlt)
      root = out;
    else if (ByteRangeEqual(out, id))
      return Frag(root, PatchList::Mk(root << 1));
    else
      return NoMatch();
  }

  LOG(DFATAL) << "should never happen";
  return NoMatch();
}